

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

bool __thiscall
QGraphicsScenePrivate::filterDescendantEvent
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QEvent *event)

{
  int iVar1;
  QGraphicsItem *this_00;
  ulong uVar2;
  
  if (item == (QGraphicsItem *)0x0) {
    return false;
  }
  if ((((item->d_ptr).d)->field_0x162 & 8) != 0) {
    for (this_00 = QGraphicsItem::parentItem(item); this_00 != (QGraphicsItem *)0x0;
        this_00 = QGraphicsItem::parentItem(this_00)) {
      uVar2 = *(ulong *)&((this_00->d_ptr).d)->field_0x160;
      if ((uVar2 >> 0x3d & 1) != 0) {
        iVar1 = (*this_00->_vptr_QGraphicsItem[0xc])(this_00,item,event);
        if ((char)iVar1 != '\0') {
          return true;
        }
        uVar2 = *(ulong *)&((this_00->d_ptr).d)->field_0x160;
      }
      if (((uint)uVar2 >> 0x13 & 1) == 0) {
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool QGraphicsScenePrivate::filterDescendantEvent(QGraphicsItem *item, QEvent *event)
{
    if (item && (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorFiltersChildEvents)) {
        QGraphicsItem *parent = item->parentItem();
        while (parent) {
            if (parent->d_ptr->filtersDescendantEvents && parent->sceneEventFilter(item, event))
                return true;
            if (!(parent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorFiltersChildEvents))
                return false;
            parent = parent->parentItem();
        }
    }
    return false;
}